

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

EXIT_DATA * new_exit(void)

{
  uint clearmem;
  EXIT_DATA *pExit;
  uint local_c;
  EXIT_DATA *local_8;
  
  if (exit_free == (EXIT_DATA *)0x0) {
    local_8 = (EXIT_DATA *)operator_new(0x50);
    for (local_c = 0; local_c < 0x50; local_c = local_c + 1) {
      *(undefined1 *)((long)local_8->exit_info + ((ulong)local_c - 8)) = 0;
    }
    top_exit = top_exit + 1;
  }
  else {
    local_8 = exit_free;
    exit_free = exit_free->next;
  }
  (local_8->u1).to_room = (ROOM_INDEX_DATA *)0x0;
  local_8->next = (EXIT_DATA *)0x0;
  zero_vector(local_8->exit_info);
  local_8->key = 0;
  local_8->keyword = (char *)0x0;
  local_8->description = (char *)0x0;
  return local_8;
}

Assistant:

EXIT_DATA *new_exit(void)
{
	EXIT_DATA *pExit;

	if (!exit_free)
	{
		pExit = new EXIT_DATA;
		CLEAR_MEM(pExit, sizeof(EXIT_DATA))
		top_exit++;
	}
	else
	{
		pExit = exit_free;
		exit_free = exit_free->next;
	}

	pExit->u1.to_room = nullptr; /* ROM OLC */
	pExit->next = nullptr;
	/*  pExit->vnum         =   0;                        ROM OLC */

	zero_vector(pExit->exit_info);

	pExit->key = 0;
	pExit->keyword = nullptr;
	pExit->description = nullptr;

	return pExit;
}